

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
PtexHashMap(PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
            *this)

{
  std::
  vector<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
  ::vector((vector<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
            *)0xaf7510);
  initContents(this);
  return;
}

Assistant:

PtexHashMap()
    {
        initContents();
    }